

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

void XUtf8_measure_extents
               (Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int *xx,int *yy,int *ww,
               int *hh,char *string,int num_bytes)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  uint local_198;
  uint no_spc;
  uint ucs;
  int ulen;
  int fnt_dsc;
  int fnt_asc;
  int dir_ret;
  XCharStruct sizes;
  int yt;
  int hs;
  int ht;
  int wd;
  int *ranges;
  int iStack_158;
  char glyph [2];
  int nb_font;
  int last_fnum;
  int first;
  int i;
  int fnum;
  XChar2b buf [128];
  XFontStruct **fonts;
  int *encodings;
  int *yy_local;
  int *xx_local;
  GC gc_local;
  XUtf8FontStruct *font_set_local;
  Drawable d_local;
  Display *display_local;
  
  hs = 0;
  yt = 0;
  sizes.width = -1;
  sizes.ascent = 0x7fff;
  fnt_dsc = 0;
  ulen = 0;
  ucs = 0;
  ranges._4_4_ = font_set->nb_font;
  if (0 < ranges._4_4_) {
    piVar1 = font_set->ranges;
    buf._248_8_ = font_set->fonts;
    piVar2 = font_set->encodings;
    last_fnum = 0;
    first = 0;
    while( true ) {
      iVar3 = first;
      bVar7 = false;
      if (first < ranges._4_4_) {
        bVar7 = *(XFontStruct **)(buf._248_8_ + (long)first * 8) == (XFontStruct *)0x0;
      }
      if (!bVar7) break;
      first = first + 1;
    }
    if (first < ranges._4_4_) {
      for (; iStack_158 = first, 0 < num_bytes; num_bytes = num_bytes - no_spc) {
        if (0x78 < last_fnum) {
          XSetFont(display,gc,*(undefined8 *)(*(long *)(buf._248_8_ + (long)first * 8) + 8));
          XTextExtents16(*(undefined8 *)(buf._248_8_ + (long)first * 8),&i,last_fnum,&fnt_dsc,&ulen,
                         &ucs,&fnt_asc);
          hs = (short)dir_ret + hs;
          sizes._8_4_ = (int)dir_ret._2_2_ + (int)sizes.lbearing;
          if (yt < (int)sizes._8_4_) {
            yt = sizes._8_4_;
          }
          if (-(int)dir_ret._2_2_ < (int)sizes._4_4_) {
            sizes._4_4_ = -(int)dir_ret._2_2_;
          }
          last_fnum = 0;
        }
        no_spc = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&local_198);
        if ((int)no_spc < 1) {
          no_spc = 1;
        }
        uVar4 = XUtf8IsNonSpacing(local_198);
        uVar5 = (uint)uVar4;
        first = iVar3;
        if (uVar5 != 0) {
          local_198 = uVar5;
        }
        while ((first < ranges._4_4_ &&
               (((*(long *)(buf._248_8_ + (long)first * 8) == 0 ||
                 (iVar6 = ucs2fontmap((char *)((long)&ranges + 2),local_198,piVar2[first]),
                 iVar6 < 0)) ||
                ((piVar2[first] == 0 &&
                 (((int)local_198 < piVar1[first << 1] || (piVar1[first * 2 + 1] < (int)local_198)))
                 )))))) {
          first = first + 1;
        }
        if (first == ranges._4_4_) {
          ucs2fontmap((char *)((long)&ranges + 2),0x3f,piVar2[iVar3]);
          first = iVar3;
        }
        if ((iStack_158 == first) && (uVar5 == 0)) {
          *(undefined1 *)((long)&i + (long)last_fnum * 2) = ranges._2_1_;
          *(undefined1 *)((long)&i + (long)last_fnum * 2 + 1) = ranges._3_1_;
        }
        else {
          XSetFont(display,gc,*(undefined8 *)(*(long *)(buf._248_8_ + (long)iStack_158 * 8) + 8));
          XTextExtents16(*(undefined8 *)(buf._248_8_ + (long)iStack_158 * 8),&i,last_fnum,&fnt_dsc,
                         &ulen,&ucs,&fnt_asc);
          hs = (short)dir_ret + hs;
          sizes._8_4_ = (int)dir_ret._2_2_ + (int)sizes.lbearing;
          if (yt < (int)sizes._8_4_) {
            yt = sizes._8_4_;
          }
          if (-(int)dir_ret._2_2_ < (int)sizes._4_4_) {
            sizes._4_4_ = -(int)dir_ret._2_2_;
          }
          last_fnum = 0;
          i._0_1_ = ranges._2_1_;
          i._1_1_ = ranges._3_1_;
          if (uVar5 != 0) {
            iVar6 = XTextWidth16(*(undefined8 *)(buf._248_8_ + (long)first * 8),&i,1);
            hs = hs - iVar6;
          }
        }
        last_fnum = last_fnum + 1;
        string = string + (int)no_spc;
      }
      XSetFont(display,gc,*(undefined8 *)(*(long *)(buf._248_8_ + (long)first * 8) + 8));
      XTextExtents16(*(undefined8 *)(buf._248_8_ + (long)first * 8),&i,last_fnum,&fnt_dsc,&ulen,&ucs
                     ,&fnt_asc);
      if (yt < (int)dir_ret._2_2_ + (int)sizes.lbearing) {
        yt = (int)dir_ret._2_2_ + (int)sizes.lbearing;
      }
      if (-(int)dir_ret._2_2_ < (int)sizes._4_4_) {
        sizes._4_4_ = -(int)dir_ret._2_2_;
      }
      *ww = (short)dir_ret + hs;
      *hh = yt;
      *xx = 0;
      *yy = sizes._4_4_;
    }
  }
  return;
}

Assistant:

void
XUtf8_measure_extents(
        Display         	*display,
        Drawable        	d,
        XUtf8FontStruct  *font_set,
        GC              	gc,
        int             	*xx,     /* x-offset from origin */
        int             	*yy,     /* y-offset from origin */
        int             	*ww,     /* overall inked width  */
        int             	*hh,     /* maximum inked height */
        const char      	*string, /* text to measure */
        int             	num_bytes) {
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  int wd = 0; /* accumulates the width of the text */
  int ht = 0; /* used to find max height in text */
  int hs;     /* "height sum" of current text segment */
  int yt = 0x7FFFFFFF; /* used to find bounding rectangle delta-y */
  /* int res; */ /* result from calling XTextExtents16() - we should test this is OK! */
  /* FC: the man does not specify error codes for it, but X will generate X errors like BadGC or BadFont. */

  XCharStruct sizes;
  int dir_ret = 0;
  int fnt_asc = 0;
  int fnt_dsc = 0;

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      /* res = */ XTextExtents16(fonts[last_fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	wd -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
  /* recover the dimensions - should verify that res == 0 first! */
  wd += sizes.width; /* accumulate the width */
  hs = sizes.ascent + sizes.descent; /* total height */
  if(hs > ht) ht = hs; /* new height exceeds previous height */
  if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
  /* return values */
  *ww = wd; /* width of inked area rectangle */
  *hh = ht; /* max height of inked area rectangle */
  *xx = 0;  /* x-offset from origin to start of inked area - this is wrong! */
  *yy = yt; /* y-offset from origin to start of inked rectangle */
}